

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDisallowedCommand.h
# Opt level: O1

void __thiscall cmDisallowedCommand::~cmDisallowedCommand(cmDisallowedCommand *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_cmCommand)._vptr_cmCommand = (_func_int **)&PTR__cmDisallowedCommand_0066cb78;
  if (this->Command != (cmCommand *)0x0) {
    (*this->Command->_vptr_cmCommand[1])();
  }
  (this->super_cmCommand)._vptr_cmCommand = (_func_int **)&PTR__cmCommand_0066c330;
  pcVar1 = (this->super_cmCommand).Error._M_dataplus._M_p;
  paVar2 = &(this->super_cmCommand).Error.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~cmDisallowedCommand() CM_OVERRIDE { delete this->Command; }